

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerSetGlobal(HelicsBroker broker,char *valueName,char *value,HelicsError *err)

{
  element_type *peVar1;
  BrokerObject *pBVar2;
  size_t sVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  
  pBVar2 = helics::getBrokerObject(broker,err);
  if ((pBVar2 != (BrokerObject *)0x0) &&
     (peVar1 = (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    if (valueName != (char *)0x0) {
      sVar3 = strlen(valueName);
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (value != (char *)0x0) {
        sVar4 = strlen(value);
        _Var5._M_p = value;
      }
      (*peVar1->_vptr_Broker[0x12])(peVar1,sVar3,valueName,sVar4,_Var5._M_p);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "Global name cannot be null";
    }
  }
  return;
}

Assistant:

void helicsBrokerSetGlobal(HelicsBroker broker, const char* valueName, const char* value, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    brk->setGlobal(valueName, AS_STRING_VIEW(value));
}